

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseHelper.cpp
# Opt level: O1

TFunction * __thiscall
glslang::HlslParseContext::makeConstructorCall(HlslParseContext *this,TSourceLoc *loc,TType *type)

{
  TOperator tOp;
  TPoolAllocator *this_00;
  TFunction *this_01;
  char *pcVar1;
  TString empty;
  TString local_50;
  
  tOp = TIntermediate::mapTypeToConstructorOp
                  ((this->super_TParseContextBase).super_TParseVersions.intermediate,type);
  if (tOp == EOpNull) {
    pcVar1 = TType::getBasicString((uint)(byte)type->field_0x8);
    this_01 = (TFunction *)0x0;
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
              (this,loc,"cannot construct this type",pcVar1,"");
  }
  else {
    local_50._M_dataplus.super_allocator_type.allocator = GetThreadPoolAllocator();
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
    _M_construct<char_const*>
              ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)&local_50,
               "");
    this_00 = GetThreadPoolAllocator();
    this_01 = (TFunction *)TPoolAllocator::allocate(this_00,0x160);
    TFunction::TFunction(this_01,&local_50,type,tOp);
  }
  return this_01;
}

Assistant:

TFunction* HlslParseContext::makeConstructorCall(const TSourceLoc& loc, const TType& type)
{
    TOperator op = intermediate.mapTypeToConstructorOp(type);

    if (op == EOpNull) {
        error(loc, "cannot construct this type", type.getBasicString(), "");
        return nullptr;
    }

    TString empty("");

    return new TFunction(&empty, type, op);
}